

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readResponseHeaders(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  uint uVar1;
  SourceLocation location;
  bool bVar2;
  coroutine_handle<void> handle;
  undefined8 in_RSI;
  FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr___00;
  HttpHeaders *this_02;
  
  handle._M_fr_ptr = operator_new(0x548);
  *(code **)handle._M_fr_ptr = readResponseHeaders;
  *(code **)((long)handle._M_fr_ptr + 8) = readResponseHeaders;
  this_00 = (Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)handle._M_fr_ptr + 0x10);
  *(undefined8 *)((long)handle._M_fr_ptr + 0x538) = in_RSI;
  location.function = "readResponseHeaders";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x640;
  location.columnNumber = 0x3c;
  kj::_::Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::Coroutine
            (this_00,handle,location);
  kj::_::Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
  get_return_object((Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
                     *)this);
  this_01 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x530);
  readMessageHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)handle._M_fr_ptr + 0x278);
  co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x540) = 0;
  bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar2) {
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    await_resume((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
                 ((long)handle._M_fr_ptr + 0x470),__return_storage_ptr__);
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    ~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    uVar1 = ((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
            ((long)handle._M_fr_ptr + 0x470))->tag;
    if (uVar1 == 1) {
      __return_storage_ptr___00 =
           (FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
           ((long)handle._M_fr_ptr + 0x4f0);
      this_02 = (HttpHeaders *)(*(long *)((long)handle._M_fr_ptr + 0x538) + 0x48);
      HttpHeaders::clear(this_02);
      HttpHeaders::tryParseResponse
                (__return_storage_ptr___00,this_02,
                 *(ArrayPtr<char> *)((long)handle._M_fr_ptr + 0x478));
      kj::_::Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
      fulfill(this_00,__return_storage_ptr___00);
    }
    else {
      if (uVar1 != 2) {
        kj::_::unreachable();
      }
      __return_storage_ptr___00 =
           (FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
           ((long)handle._M_fr_ptr + 0x4b0);
      *(undefined4 *)((long)handle._M_fr_ptr + 0x4b0) = 2;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4b8) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x478);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4c0) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x480);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4c8) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x488);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4d0) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x490);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4d8) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x498);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4e0) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4a0);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4e8) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4a8);
      kj::_::Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
      fulfill(this_00,__return_storage_ptr___00);
    }
    if (__return_storage_ptr___00->tag - 1 < 2) {
      __return_storage_ptr___00->tag = 0;
    }
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x540) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

inline kj::Promise<HttpHeaders::ResponseOrProtocolError> readResponseHeaders() {
    // Note: readResponseHeaders() could be called multiple times concurrently when pipelining
    //   requests. readMessageHeaders() will serialize these, but it's important not to mess with
    //   state (like calling headers.clear()) before said serialization has taken place.
    auto headersOrError = co_await readMessageHeaders();
    KJ_SWITCH_ONEOF(headersOrError) {
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        co_return protocolError;
      }
      KJ_CASE_ONEOF(text, kj::ArrayPtr<char>) {
        headers.clear();
        co_return headers.tryParseResponse(text);
      }
    }

    KJ_UNREACHABLE;
  }